

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O3

void __thiscall BPlusTree::PrintStats(BPlusTree *this)

{
  element_type *peVar1;
  undefined8 *puVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  BPlusTree *pBVar6;
  shared_ptr<Node> local_40;
  shared_ptr<Node> local_30;
  
  peVar1 = (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------- B+ Tree Statistic --------------",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  if (peVar1 == (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"B+ tree is empty",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Parmeter N of B+ Tree: ",0x17);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of nodes in B+ Tree: ",0x1c);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->numNodes);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Height of B+ Tree: ",0x13);
    iVar3 = GetHeight(this);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Content of root node: ",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    pBVar6 = (BPlusTree *)std::ostream::put('\x10');
    std::ostream::flush();
    local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
      }
    }
    PrintNodeWithoutPtr(pBVar6,&local_40);
    if (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Content of 1st child node: ",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    pBVar6 = (BPlusTree *)std::ostream::put('\x10');
    std::ostream::flush();
    puVar2 = *(undefined8 **)
              &(((this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data;
    local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)*puVar2;
    local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
    if (local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
      }
    }
    PrintNodeWithoutPtr(pBVar6,&local_30);
    if (local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------------------------------------------",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

void BPlusTree::PrintStats() {
    if (root == nullptr) {
        std::cout << "------------- B+ Tree Statistic --------------" << std::endl;
        std::cout << "B+ tree is empty" << std::endl;
        std::cout << "----------------------------------------------" << std::endl;
        return;
    }
    std::cout << "------------- B+ Tree Statistic --------------" << std::endl;
    std::cout << "Parmeter N of B+ Tree: " << size << std::endl;
    std::cout << "Number of nodes in B+ Tree: " << numNodes << std::endl;
    std::cout << "Height of B+ Tree: " << GetHeight() << std::endl;
    std::cout << "Content of root node: " << std::endl;
    PrintNodeWithoutPtr(root);
    std::cout << "Content of 1st child node: " << std::endl;
    PrintNodeWithoutPtr(std::static_pointer_cast<Node>(root->ptrs[0]));
    std::cout << "----------------------------------------------" << std::endl;
}